

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iidentity16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_ECX;
  __m128i *in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar8 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  int i;
  __m128i zero;
  __m128i a1_high;
  __m128i a1_low;
  __m128i a0_high;
  __m128i a0_low;
  __m128i offset;
  __m128i fact;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  longlong local_2a8;
  longlong lStack_2a0;
  longlong local_298;
  longlong lStack_290;
  int local_280;
  int local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_268;
  undefined4 uStack_264;
  uint uStack_260;
  uint uStack_25c;
  undefined4 local_258;
  undefined4 uStack_254;
  uint uStack_250;
  uint uStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  __m128i *local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  longlong local_1a8;
  undefined8 uStack_1a0;
  longlong local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  ulong uStack_180;
  undefined8 local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  undefined8 uStack_140;
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  int local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  longlong local_c8;
  longlong lStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  longlong local_a8;
  longlong lStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_3c;
  ulong local_38;
  ulong uStack_30;
  undefined4 local_1c;
  ulong local_18;
  ulong uStack_10;
  
  local_10c = 0x2d42;
  local_ec = 0x2d42;
  local_f0 = 0x2d42;
  local_f4 = 0x2d42;
  local_f8 = 0x2d42;
  local_218 = 0x2d4200002d42;
  uStack_210 = 0x2d4200002d42;
  local_110 = 0x800;
  local_cc = 0x800;
  local_d0 = 0x800;
  local_d4 = 0x800;
  local_d8 = 0x800;
  local_158 = 0x80000000800;
  uStack_150 = 0x80000000800;
  local_128 = 0;
  uStack_120 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_228 = 0x800;
  uStack_220 = 0x800;
  for (local_27c = 0; local_27c < 0x10; local_27c = local_27c + 1) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)local_27c * 0x10);
    local_58 = *(undefined8 *)*pauVar1;
    uStack_50 = *(undefined8 *)(*pauVar1 + 8);
    auVar7._8_8_ = 0x2d4200002d42;
    auVar7._0_8_ = 0x2d4200002d42;
    auVar8 = pmuldq(*pauVar1,auVar7);
    local_238 = auVar8._0_8_;
    uVar2 = local_238;
    uStack_230 = auVar8._8_8_;
    uVar3 = uStack_230;
    local_1c8 = 0x800;
    uStack_1c0 = 0x800;
    local_1b8._0_4_ = auVar8._0_4_;
    local_1b8._4_4_ = auVar8._4_4_;
    uStack_1b0._0_4_ = auVar8._8_4_;
    uStack_1b0._4_4_ = auVar8._12_4_;
    local_238 = CONCAT44(local_1b8._4_4_,(int)local_1b8 + 0x800);
    uStack_230._0_4_ = (int)uStack_1b0 + 0x800;
    uStack_230._4_4_ = uStack_1b0._4_4_;
    local_18 = local_238;
    uStack_10 = uStack_230;
    local_1c = 0xc;
    local_138 = local_238 >> 0xc;
    uStack_170 = uStack_230 >> 0xc;
    uStack_230 = uStack_170;
    local_238 = local_138;
    auVar8 = *(undefined1 (*) [16])(in_RDI + (long)local_27c * 0x10);
    local_248 = auVar8._4_8_;
    local_78 = local_248;
    uStack_240 = (ulong)auVar8._12_4_;
    uStack_70 = uStack_240;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auVar8._4_12_;
    auVar8._8_8_ = 0x2d4200002d42;
    auVar8._0_8_ = 0x2d4200002d42;
    auVar8 = pmuldq(auVar6,auVar8);
    local_248 = auVar8._0_8_;
    uVar4 = local_248;
    uStack_240 = auVar8._8_8_;
    uVar5 = uStack_240;
    local_1e8 = 0x800;
    uStack_1e0 = 0x800;
    local_1d8._0_4_ = auVar8._0_4_;
    local_1d8._4_4_ = auVar8._4_4_;
    uStack_1d0._0_4_ = auVar8._8_4_;
    uStack_1d0._4_4_ = auVar8._12_4_;
    local_248 = CONCAT44(local_1d8._4_4_,(int)local_1d8 + 0x800);
    uStack_240._0_4_ = (int)uStack_1d0 + 0x800;
    uStack_240._4_4_ = uStack_1d0._4_4_;
    local_38 = local_248;
    uStack_30 = uStack_240;
    local_3c = 0xc;
    local_148 = local_248 >> 0xc;
    uStack_180 = uStack_240 >> 0xc;
    uStack_240 = uStack_180;
    local_248 = local_148;
    local_178._0_4_ = (undefined4)local_138;
    local_258 = (undefined4)local_178;
    local_178._4_4_ = local_1b8._4_4_ >> 0xc;
    uStack_250 = local_178._4_4_;
    local_188._0_4_ = (undefined4)local_148;
    uStack_254 = (undefined4)local_188;
    local_188._4_4_ = local_1d8._4_4_ >> 0xc;
    uStack_24c = local_188._4_4_;
    uStack_130._0_4_ = (undefined4)uStack_170;
    local_268 = (undefined4)uStack_130;
    uStack_130._4_4_ = uStack_1b0._4_4_ >> 0xc;
    uStack_260 = uStack_130._4_4_;
    uStack_140._0_4_ = (undefined4)uStack_180;
    uStack_264 = (undefined4)uStack_140;
    uStack_140._4_4_ = uStack_1d0._4_4_ >> 0xc;
    uStack_25c = uStack_140._4_4_;
    local_198 = CONCAT44((undefined4)local_188,(undefined4)local_178);
    uStack_190 = CONCAT44(local_188._4_4_,local_178._4_4_);
    local_1a8 = CONCAT44((undefined4)uStack_140,(undefined4)uStack_130);
    uStack_1a0 = CONCAT44(uStack_140._4_4_,uStack_130._4_4_);
    in_RSI[local_27c][0] = local_198;
    in_RSI[local_27c][1] = local_1a8;
    local_1d8 = uVar4;
    uStack_1d0 = uVar5;
    local_1b8 = uVar2;
    uStack_1b0 = uVar3;
    local_188 = local_148;
    local_178 = local_138;
    uStack_140 = uStack_180;
    uStack_130 = uStack_170;
    local_88 = local_218;
    uStack_80 = uStack_210;
    local_68 = local_218;
    uStack_60 = uStack_210;
  }
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_280 = 0x10;
    }
    else {
      local_280 = in_R8D + 6;
    }
    local_114 = -(1 << ((char)local_280 - 1U & 0x1f));
    local_298 = CONCAT44(local_114,local_114);
    lStack_290 = CONCAT44(local_114,local_114);
    local_118 = (1 << ((char)local_280 - 1U & 0x1f)) + -1;
    local_2a8 = CONCAT44(local_118,local_118);
    lStack_2a0 = CONCAT44(local_118,local_118);
    local_1f8 = in_RSI;
    local_108 = local_218;
    uStack_100 = uStack_210;
    local_e8 = local_158;
    uStack_e0 = uStack_150;
    local_c8 = local_298;
    lStack_c0 = lStack_290;
    local_b8 = local_114;
    local_b4 = local_114;
    local_b0 = local_114;
    local_ac = local_114;
    local_a8 = local_2a8;
    lStack_a0 = lStack_2a0;
    local_98 = local_118;
    local_94 = local_118;
    local_90 = local_118;
    local_8c = local_118;
    round_shift_8x8((__m128i *)CONCAT44(local_280,in_stack_fffffffffffffd50),
                    in_stack_fffffffffffffd4c);
    highbd_clamp_epi32_sse4_1(local_1f8,local_1f8,(__m128i *)&local_298,(__m128i *)&local_2a8,0x10);
  }
  return;
}

Assistant:

static void iidentity16_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  (void)bit;
  __m128i fact = _mm_set1_epi32(2 * NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a0_low, a0_high, a1_low, a1_high;
  __m128i zero = _mm_setzero_si128();
  offset = _mm_unpacklo_epi32(offset, zero);

  for (int i = 0; i < 16; i++) {
    a0_low = _mm_mul_epi32(in[i], fact);
    a0_low = _mm_add_epi32(a0_low, offset);
    a0_low = _mm_srli_epi64(a0_low, NewSqrt2Bits);

    a0_high = _mm_srli_si128(in[i], 4);
    a0_high = _mm_mul_epi32(a0_high, fact);
    a0_high = _mm_add_epi32(a0_high, offset);
    a0_high = _mm_srli_epi64(a0_high, NewSqrt2Bits);

    a1_low = _mm_unpacklo_epi32(a0_low, a0_high);
    a1_high = _mm_unpackhi_epi32(a0_low, a0_high);
    out[i] = _mm_unpacklo_epi64(a1_low, a1_high);
  }

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 16);
  }
}